

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall World::~World(World *this)

{
  pointer ppMVar1;
  Map *this_00;
  pointer ppHVar2;
  Home *this_01;
  void *pvVar3;
  EIF *this_02;
  ENF *this_03;
  ESF *this_04;
  ECF *this_05;
  GuildManager *this_06;
  bool bVar4;
  mapped_type *this_07;
  pointer ppHVar5;
  long lVar6;
  pointer ppMVar7;
  allocator<char> local_59;
  vector<Map_*,_std::allocator<Map_*>_> *local_58;
  key_type local_50;
  
  local_58 = &this->maps;
  ppMVar1 = (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar7 = (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppMVar7 != ppMVar1; ppMVar7 = ppMVar7 + 1) {
    this_00 = *ppMVar7;
    if (this_00 != (Map *)0x0) {
      Map::~Map(this_00);
    }
    operator_delete(this_00,0xd8);
  }
  ppHVar2 = (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppHVar5 = (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppHVar5 != ppHVar2; ppHVar5 = ppHVar5 + 1) {
    this_01 = *ppHVar5;
    if (this_01 != (Home *)0x0) {
      Home::~Home(this_01);
    }
    operator_delete(this_01,0x50);
  }
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 8) {
    pvVar3 = *(void **)((long)(this->boards)._M_elems + lVar6);
    if (pvVar3 != (void *)0x0) {
      std::__cxx11::_List_base<Board_Post_*,_std::allocator<Board_Post_*>_>::_M_clear
                ((_List_base<Board_Post_*,_std::allocator<Board_Post_*>_> *)((long)pvVar3 + 8));
    }
    operator_delete(pvVar3,0x20);
  }
  this_02 = this->eif;
  if (this_02 != (EIF *)0x0) {
    EIF::~EIF(this_02);
  }
  operator_delete(this_02,0x38);
  this_03 = this->enf;
  if (this_03 != (ENF *)0x0) {
    ENF::~ENF(this_03);
  }
  operator_delete(this_03,0x38);
  this_04 = this->esf;
  if (this_04 != (ESF *)0x0) {
    ESF::~ESF(this_04);
  }
  operator_delete(this_04,0x38);
  this_05 = this->ecf;
  if (this_05 != (ECF *)0x0) {
    ECF::~ECF(this_05);
  }
  operator_delete(this_05,0x38);
  this_06 = this->guildmanager;
  if (this_06 != (GuildManager *)0x0) {
    GuildManager::~GuildManager(this_06);
  }
  operator_delete(this_06,0x80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"TimedSave",&local_59);
  this_07 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->config,&local_50);
  bVar4 = util::variant::GetBool(this_07);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar4) {
    Database::Commit(&this->db);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Quest>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Quest>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
  ::~_Rb_tree(&(this->quests)._M_t);
  std::_Vector_base<Home_*,_std::allocator<Home_*>_>::~_Vector_base
            (&(this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>);
  std::_Vector_base<Map_*,_std::allocator<Map_*>_>::~_Vector_base
            (&local_58->super__Vector_base<Map_*,_std::allocator<Map_*>_>);
  std::_Vector_base<Party_*,_std::allocator<Party_*>_>::~_Vector_base
            (&(this->parties).super__Vector_base<Party_*,_std::allocator<Party_*>_>);
  std::_Vector_base<Character_*,_std::allocator<Character_*>_>::~_Vector_base
            (&(this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>);
  I18N::~I18N(&this->i18n);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->formulas_cache)._M_h);
  Config::~Config(&this->skills_config);
  Config::~Config(&this->home_config);
  Config::~Config(&this->formulas_config);
  Config::~Config(&this->arenas_config);
  Config::~Config(&this->shops_config);
  Config::~Config(&this->drops_config);
  Config::~Config(&this->admin_config);
  Config::~Config(&this->config);
  std::
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ::~vector(&this->npc_data);
  Database::~Database(&this->db);
  Timer::~Timer(&this->timer);
  return;
}

Assistant:

World::~World()
{
	UTIL_FOREACH(this->maps, map)
	{
		delete map;
	}

	UTIL_FOREACH(this->homes, home)
	{
		delete home;
	}

	UTIL_FOREACH(this->boards, board)
	{
		delete board;
	}

	delete this->eif;
	delete this->enf;
	delete this->esf;
	delete this->ecf;

	delete this->guildmanager;

	if (this->config["TimedSave"])
	{
		this->db.Commit();
	}
}